

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int AF_AActor_GetDefaultSpeed
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  bool bVar1;
  int iVar2;
  char *__assertion;
  PClassActor *type;
  double val;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_004336b5;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    type = (PClassActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (type != (PClassActor *)0x0) {
        bVar1 = PClass::IsAncestorOf(AActor::RegistrationInfo.MyClass,(PClass *)type);
        if (!bVar1) {
          __assertion = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_004336b5;
        }
        goto LAB_00433680;
      }
    }
    else if (type != (PClassActor *)0x0) goto LAB_004336a5;
    type = (PClassActor *)0x0;
LAB_00433680:
    val = GetDefaultSpeed(type);
    if (numret < 1) {
      iVar2 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                      ,0x190b,
                      "int AF_AActor_GetDefaultSpeed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      VMReturn::SetFloat(ret,val);
      iVar2 = 1;
    }
    return iVar2;
  }
LAB_004336a5:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_004336b5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x190a,
                "int AF_AActor_GetDefaultSpeed(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
  ;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, GetDefaultSpeed)
{
	PARAM_PROLOGUE;
	PARAM_CLASS(type, AActor);
	ACTION_RETURN_FLOAT(GetDefaultSpeed(type));
}